

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe_tests.cc
# Opt level: O3

bool lf::uscalfe::test::scalarFEEvalNodeTest<double>(ScalarReferenceFiniteElement<double> *fe_desc)

{
  size_type cols;
  Scalar SVar1;
  Matrix<double,_1,__1,_1,_1,__1> *lhs;
  double *pdVar2;
  Index IVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RowVectorXd rand_coeffs;
  size_type N_rsf;
  RowVectorXd nodvals;
  Matrix<double,__1,__1,_0,__1,__1> rsf_at_evln;
  Matrix<double,_1,__1,_1,_1,__1> coeffs;
  size_type N_evln;
  MatrixXd evl_nodes;
  scalar_sum_op<double,_double> local_e9;
  Matrix<double,_1,__1,_1,_1,__1> local_e8;
  undefined1 local_d0 [8];
  variable_if_dynamic<long,__1> local_c8;
  RhsNested pMStack_c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  local_a8;
  uint local_8c;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_88;
  Rhs local_78;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  Lhs local_50;
  uint local_3c;
  void *local_38 [2];
  double *local_28;
  
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[9])(local_38,fe_desc);
  local_3c = (*fe_desc->_vptr_ScalarReferenceFiniteElement[10])(fe_desc);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_28;
  testing::internal::CmpHelperEQ<long,unsigned_int>
            ((internal *)local_d0,"evl_nodes.cols()","N_evln",(long *)&local_78,&local_3c);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data + 2),"No. evl nodes mismatch",0x16);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_c8.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x25,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        != (double *)0x0) {
      (**(code **)((long)*local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_data + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8.m_value !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c8.m_value);
  }
  local_8c = (*fe_desc->_vptr_ScalarReferenceFiniteElement[4])(fe_desc);
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[7])(&local_78,fe_desc,local_38);
  local_a8.m_lhs =
       (LhsNested)
       local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  testing::internal::CmpHelperEQ<long,unsigned_int>
            ((internal *)local_d0,"rsf_at_evln.rows()","N_rsf",(long *)&local_a8,&local_8c);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8.m_lhs + 1),"No. rsf mismatch",0x10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_c8.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x2a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_a8.m_lhs != (LhsNested)0x0) {
      (*(code *)((local_a8.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                m_storage.m_data[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8.m_value !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c8.m_value);
  }
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                    *)local_d0,1,(ulong)local_8c,(scalar_random_op<double> *)&local_a8);
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>,double,double>
            (&local_e8,
             (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              *)local_d0,(assign_op<double,_double> *)&local_a8);
  IVar3 = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
  pdVar2 = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data;
  if (0 < local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols)
  {
    lVar7 = 0;
    do {
      iVar4 = rand();
      pdVar2[lVar7] = ((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0;
      lVar7 = lVar7 + 1;
    } while (IVar3 != lVar7);
  }
  Eigen::
  Product<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_d0,&local_e8,&local_78);
  lhs = (Matrix<double,_1,__1,_1,_1,__1> *)CONCAT71(local_d0._1_7_,local_d0[0]);
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_cols = 0;
  cols = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_c8.m_value + 0x10))->_M_allocated_capacity;
  if ((cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) < 1)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = execv;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize(&local_88,1,cols);
  if (local_88.m_storage.m_cols !=
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_c8.m_value + 0x10))->_M_allocated_capacity) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&local_88,1,
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_c8.m_value + 0x10))->_M_allocated_capacity);
  }
  Eigen::internal::
  generic_product_impl_base<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,1,_1,1,1,_1>>
            ((Matrix<double,_1,__1,_1,_1,__1> *)&local_88,lhs,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_c8.m_value);
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[0xb])(&local_50,fe_desc,&local_88);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp(&local_a8,&local_50,&local_e8,(scalar_difference_op<double,_double> *)local_d0);
  local_c8.m_value = (long)local_a8.m_lhs;
  pMStack_c0 = local_a8.m_rhs;
  if (((local_a8.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
      m_cols == 0) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    SVar1 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,-1,1,1,-1>const,Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,_1,1,1,_1>const,Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                        *)local_d0,&local_e9);
    uVar8 = SUB84(SVar1,0);
    uVar9 = (undefined4)((ulong)SVar1 >> 0x20);
  }
  testing::internal::DoubleNearPredFormat
            (local_60,"(coeffs - rand_coeffs).norm()","0.0","1e-13",
             SQRT((double)CONCAT44(uVar9,uVar8)),0.0,1e-13);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_d0._1_7_,local_d0[0]) + 0x10),"Coefficient mismatch",0x14)
    ;
    Eigen::operator<<((ostream *)(CONCAT71(local_d0._1_7_,local_d0[0]) + 0x10),
                      (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_d0._1_7_,local_d0[0]) + 0x10)," <-> ",5);
    Eigen::operator<<((ostream *)(CONCAT71(local_d0._1_7_,local_d0[0]) + 0x10),
                      (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_e8);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x35,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)CONCAT71(local_d0._1_7_,local_d0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0._1_7_,local_d0[0]) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  free(local_88.m_storage.m_data);
  free(local_e8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  free(local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_38[0]);
  return true;
}

Assistant:

bool scalarFEEvalNodeTest(
    const lf::fe::ScalarReferenceFiniteElement<SCALAR> &fe_desc) {
  // Evaluates a random linear combination of reference shape functions
  // at the evaluation nodes for the finite element and then reconstructs
  // the "interpolant" which must agree with what we started from

  // Fetch evaluation nodes
  const Eigen::MatrixXd evl_nodes{fe_desc.EvaluationNodes()};
  const size_type N_evln = fe_desc.NumEvaluationNodes();
  EXPECT_EQ(evl_nodes.cols(), N_evln) << "No. evl nodes mismatch";

  // Evaluate reference shape functions in evaluation nodes
  const size_type N_rsf = fe_desc.NumRefShapeFunctions();
  auto rsf_at_evln = fe_desc.EvalReferenceShapeFunctions(evl_nodes);
  EXPECT_EQ(rsf_at_evln.rows(), N_rsf) << "No. rsf mismatch";

  // Form random linear combination and store it values
  // in the evaluation nodes
  Eigen::RowVectorXd rand_coeffs{Eigen::RowVectorXd::Random(N_rsf)};
  Eigen::RowVectorXd nodvals = rand_coeffs * rsf_at_evln;

  // Reconstruct linear combination
  Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> coeffs{
      fe_desc.NodalValuesToDofs(nodvals)};
  // Check agreement of coefficients
  EXPECT_NEAR((coeffs - rand_coeffs).norm(), 0.0, 1e-13)
      << "Coefficient mismatch" << coeffs << " <-> " << rand_coeffs;
  return true;
}